

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,ValueSymbol *args,SourceRange *args_1)

{
  NamedValueExpression *this_00;
  
  this_00 = (NamedValueExpression *)allocate(this,0x38,8);
  ast::NamedValueExpression::NamedValueExpression(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }